

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Own<kj::Directory::Replacer<kj::Directory>_> __thiscall
kj::anon_unknown_8::DiskDirectory::replaceSubdir(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Iface *pIVar4;
  _func_int **pp_Var5;
  int iVar6;
  int iVar7;
  undefined8 *puVar8;
  AutoCloseFd AVar9;
  Clock *clock;
  undefined4 in_register_0000000c;
  Replacer<kj::Directory> *extraout_RDX;
  Replacer<kj::Directory> *extraout_RDX_00;
  Replacer<kj::Directory> *pRVar10;
  WriteMode in_R8D;
  undefined8 uVar11;
  size_t *this_00;
  Directory *ptrCopy;
  String *__file;
  PathPtr finalName;
  Own<kj::Directory::Replacer<kj::Directory>_> OVar12;
  AutoCloseFd subdirFd;
  mode_t acl;
  NullableValue<kj::String> temp;
  AutoCloseFd local_b8;
  AutoCloseFd local_b0;
  NullableValue<kj::String> local_a8;
  Function<int_(kj::StringPtr)> local_88;
  ArrayDisposer *local_78;
  _func_int **local_70;
  undefined4 local_64;
  char local_60;
  String *local_58;
  _func_int **pp_Stack_50;
  ArrayDisposer *local_48;
  PathPtr local_40;
  
  finalName.parts.size_ = CONCAT44(in_register_0000000c,mode);
  finalName.parts.ptr = (String *)path.parts.size_;
  this_00 = &((path.parts.ptr)->content).size_;
  local_64 = 0x1c0;
  if ((in_R8D & PRIVATE) == 0) {
    local_64 = 0x1ff;
  }
  local_40.parts.ptr = finalName.parts.ptr;
  local_40.parts.size_ = finalName.parts.size_;
  local_88.impl.ptr = (Iface *)operator_new(0x18);
  (local_88.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00280880;
  local_88.impl.ptr[1]._vptr_Iface = (_func_int **)this_00;
  local_88.impl.ptr[2]._vptr_Iface = (_func_int **)&local_64;
  local_88.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::replaceSubdir(kj::PathPtr,kj::WriteMode)const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  DiskHandle::createNamedTemporary
            ((Maybe<kj::String> *)&local_a8,(DiskHandle *)this_00,finalName,in_R8D,&local_88);
  pIVar4 = local_88.impl.ptr;
  uVar3 = local_a8.field_1.value.content.size_;
  uVar2 = local_a8.field_1.value.content.ptr;
  bVar1 = local_a8.isSet;
  local_60 = local_a8.isSet;
  uVar11 = finalName.parts.ptr;
  local_70 = (_func_int **)&local_64;
  if (local_a8.isSet == true) {
    local_58 = (String *)local_a8.field_1.value.content.ptr;
    pp_Stack_50 = (_func_int **)local_a8.field_1.value.content.size_;
    local_78 = local_a8.field_1.value.content.disposer;
    local_48 = local_a8.field_1.value.content.disposer;
    local_a8.field_1.value.content.ptr = (char *)0x0;
    local_a8.field_1.value.content.size_ = 0;
    uVar11 = uVar2;
    local_70 = (_func_int **)uVar3;
  }
  if (local_88.impl.ptr != (Iface *)0x0) {
    local_88.impl.ptr = (Iface *)0x0;
    (**(local_88.impl.disposer)->_vptr_Disposer)
              (local_88.impl.disposer,pIVar4->_vptr_Iface[-2] + (long)&pIVar4->_vptr_Iface);
  }
  if (bVar1 == false) {
    clock = nullClock();
    newInMemoryDirectory((kj *)&local_a8,clock);
    AVar9 = (AutoCloseFd)operator_new(0x20);
    *(undefined4 *)((long)AVar9 + 8) = 3;
    *(undefined ***)AVar9 = &PTR_get_00280958;
    *(undefined8 *)((long)AVar9 + 0x10) = local_a8._0_8_;
    *(char **)((long)AVar9 + 0x18) = local_a8.field_1.value.content.ptr;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::BrokenReplacer<kj::Directory>>::
          instance;
    (this->super_DiskHandle).fd = AVar9;
    pRVar10 = extraout_RDX_00;
  }
  else {
    __file = (String *)0x2214ff;
    if (local_70 != (_func_int **)0x0) {
      __file = (String *)uVar11;
    }
    do {
      iVar6 = openat((int)*this_00,(char *)__file,0x90000);
      if (-1 < iVar6) goto LAB_002197df;
      iVar7 = _::Debug::getOsErrorNumber(false);
    } while (iVar7 == -1);
    if (iVar7 != 0) {
      local_b8.fd = 0;
      local_b8.unwindDetector.uncaughtCount = 0;
      local_a8.isSet = false;
      local_a8._1_7_ = 0;
      local_a8.field_1.value.content.ptr = (char *)0x0;
      _::Debug::Fault::init
                ((Fault *)&local_b8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      _::Debug::Fault::fatal((Fault *)&local_b8);
    }
LAB_002197df:
    local_b8.fd = iVar6;
    UnwindDetector::UnwindDetector(&local_b8.unwindDetector);
    local_b0.fd = local_b8.fd;
    UnwindDetector::UnwindDetector(&local_b0.unwindDetector);
    local_b8.fd = -1;
    puVar8 = (undefined8 *)operator_new(0x10);
    pp_Var5 = local_70;
    *puVar8 = &PTR_getFd_0027f970;
    *(int *)(puVar8 + 1) = local_b0.fd;
    UnwindDetector::UnwindDetector((UnwindDetector *)((long)puVar8 + 0xc));
    local_b0.fd = -1;
    *puVar8 = &PTR_getFd_00280568;
    PathPtr::toString((String *)&local_a8,&local_40,false);
    AVar9 = (AutoCloseFd)operator_new(0x60);
    *(WriteMode *)((long)AVar9 + 8) = in_R8D;
    *(undefined ***)AVar9 = &PTR_get_002808e8;
    *(undefined8 **)((long)AVar9 + 0x10) =
         &_::HeapDisposer<kj::(anonymous_namespace)::DiskDirectory>::instance;
    *(undefined8 **)((long)AVar9 + 0x18) = puVar8;
    *(size_t **)((long)AVar9 + 0x20) = this_00;
    *(undefined8 *)((long)AVar9 + 0x28) = uVar11;
    *(_func_int ***)((long)AVar9 + 0x30) = pp_Var5;
    *(ArrayDisposer **)((long)AVar9 + 0x38) = local_78;
    local_58 = (String *)0x0;
    pp_Stack_50 = (_func_int **)0x0;
    *(undefined8 *)((long)AVar9 + 0x40) = local_a8._0_8_;
    *(char **)((long)AVar9 + 0x48) = local_a8.field_1.value.content.ptr;
    *(size_t *)((long)AVar9 + 0x50) = local_a8.field_1.value.content.size_;
    *(undefined1 *)((long)AVar9 + 0x58) = 0;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::Directory>>::
          instance;
    (this->super_DiskHandle).fd = AVar9;
    AutoCloseFd::~AutoCloseFd(&local_b0);
    AutoCloseFd::~AutoCloseFd(&local_b8);
    pRVar10 = extraout_RDX;
  }
  OVar12.ptr = pRVar10;
  OVar12.disposer = (Disposer *)this;
  return OVar12;
}

Assistant:

Own<Replacer<Directory>> replaceSubdir(PathPtr path, WriteMode mode) const override {
    return DiskHandle::replaceSubdir(path, mode);
  }